

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

Vec4 __thiscall
glu::TextureTestUtil::execSample
          (TextureTestUtil *this,Texture1DView *src,ReferenceParams *params,float s,float lod)

{
  float x_;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar1;
  Vec4 VVar2;
  Vec4 VVar3;
  float lod_local;
  float s_local;
  ReferenceParams *params_local;
  Texture1DView *src_local;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  
  if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
    x_ = tcu::Texture1DView::sampleCompare
                   (src,&params->sampler,(params->super_RenderParams).ref,s,lod);
    uVar1 = 0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,0.0,0.0,1.0);
    VVar2.m_data[2] = (float)(int)uVar1;
    VVar2.m_data[3] = (float)(int)((ulong)uVar1 >> 0x20);
    VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  else {
    VVar2 = tcu::Texture1DView::sample((Texture1DView *)this,(Sampler *)src,s,lod);
  }
  VVar3.m_data[0] = VVar2.m_data[0];
  auVar4._4_4_ = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  register0x00001244 = VVar2.m_data[3];
  return (Vec4)VVar3.m_data;
}

Assistant:

static inline tcu::Vec4 execSample (const tcu::Texture1DView& src, const ReferenceParams& params, float s, float lod)
{
	if (params.samplerType == SAMPLERTYPE_SHADOW)
		return tcu::Vec4(src.sampleCompare(params.sampler, params.ref, s, lod), 0.0, 0.0, 1.0f);
	else
		return src.sample(params.sampler, s, lod);
}